

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

void Mop_ManPrint(Mop_Man_t *p)

{
  int iCube;
  int i;
  
  printf(".%d\n",(ulong)(uint)p->nIns);
  printf(".%d\n",(ulong)(uint)p->nOuts);
  for (i = 0; i < p->vCubes->nSize; i = i + 1) {
    iCube = Vec_IntEntry(p->vCubes,i);
    Mop_ManPrintOne(p,iCube);
  }
  puts(".e");
  return;
}

Assistant:

void Mop_ManPrint( Mop_Man_t * p )
{
    int i, iCube;
    printf( ".%d\n", p->nIns );
    printf( ".%d\n", p->nOuts );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
        Mop_ManPrintOne( p, iCube );
    printf( ".e\n" );
}